

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * __thiscall
httplib::to_string_abi_cxx11_(string *__return_storage_ptr__,httplib *this,Error error)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "Success";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Unknown";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Connection";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "BindIPAddress";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Read";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Write";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "ExceedRedirectCount";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Canceled";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "SSLConnection";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "SSLLoadingCerts";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "SSLServerVerification";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "UnsupportedMultipartBoundaryChars";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Compression";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "ConnectionTimeout";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Invalid";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const Error error) {
        switch (error) {
            case Error::Success: return "Success";
            case Error::Connection: return "Connection";
            case Error::BindIPAddress: return "BindIPAddress";
            case Error::Read: return "Read";
            case Error::Write: return "Write";
            case Error::ExceedRedirectCount: return "ExceedRedirectCount";
            case Error::Canceled: return "Canceled";
            case Error::SSLConnection: return "SSLConnection";
            case Error::SSLLoadingCerts: return "SSLLoadingCerts";
            case Error::SSLServerVerification: return "SSLServerVerification";
            case Error::UnsupportedMultipartBoundaryChars:
                return "UnsupportedMultipartBoundaryChars";
            case Error::Compression: return "Compression";
            case Error::ConnectionTimeout: return "ConnectionTimeout";
            case Error::Unknown: return "Unknown";
            default: break;
        }

        return "Invalid";
    }